

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetPluginTest.cpp
# Opt level: O0

void __thiscall
TEST_SetPointerPluginTest_doublePointer_Test::testBody
          (TEST_SetPointerPluginTest_doublePointer_Test *this)

{
  TestRegistry *pTVar1;
  SetDoublePointerUtestShell *this_00;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  size_t sVar4;
  bool bVar5;
  SetDoublePointerUtestShell *doubletst;
  TEST_SetPointerPluginTest_doublePointer_Test *this_local;
  
  this_00 = (SetDoublePointerUtestShell *)
            operator_new(0x38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SetPluginTest.cpp"
                         ,0xa4);
  (this_00->super_UtestShell).lineNumber_ = 0;
  (this_00->super_UtestShell).next_ = (UtestShell *)0x0;
  (this_00->super_UtestShell).name_ = (char *)0x0;
  (this_00->super_UtestShell).file_ = (char *)0x0;
  (this_00->super_UtestShell)._vptr_UtestShell = (_func_int **)0x0;
  (this_00->super_UtestShell).group_ = (char *)0x0;
  (this_00->super_UtestShell).isRunAsSeperateProcess_ = false;
  (this_00->super_UtestShell).hasFailed_ = false;
  *(undefined6 *)&(this_00->super_UtestShell).field_0x32 = 0;
  SetDoublePointerUtestShell::SetDoublePointerUtestShell(this_00);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupSetPointerPluginTest).myRegistry_;
  (*pTVar1->_vptr_TestRegistry[2])(pTVar1,this_00);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupSetPointerPluginTest).myRegistry_;
  (*pTVar1->_vptr_TestRegistry[5])
            (pTVar1,(this->super_TEST_GROUP_CppUTestGroupSetPointerPluginTest).result_);
  pUVar2 = UtestShell::getCurrent();
  bVar5 = orig_double_ptr == &orig_double;
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar5,"CHECK","orig_double_ptr == &orig_double",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SetPluginTest.cpp"
             ,0xa8,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  sVar4 = TestResult::getCheckCount
                    ((this->super_TEST_GROUP_CppUTestGroupSetPointerPluginTest).result_);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0xe])
            (pUVar2,1,sVar4,"LONGS_EQUAL(1, result_->getCheckCount()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SetPluginTest.cpp"
             ,0xa9,pTVar3);
  if (this_00 != (SetDoublePointerUtestShell *)0x0) {
    (*(this_00->super_UtestShell)._vptr_UtestShell[1])();
  }
  return;
}

Assistant:

TEST(SetPointerPluginTest, doublePointer)
{
    SetDoublePointerUtestShell *doubletst = new SetDoublePointerUtestShell();
    myRegistry_->addTest(doubletst);
    myRegistry_->runAllTests(*result_);

    CHECK(orig_double_ptr == &orig_double);
    LONGS_EQUAL(1, result_->getCheckCount());
    delete doubletst;
}